

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

qpdf_error qpdf_next_warning(qpdf_data qpdf)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  QPDFExc *pQVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  QPDF_BOOL QVar3;
  _qpdf_error *p_Var4;
  undefined1 local_29;
  QPDFExc *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  QVar3 = qpdf_more_warnings(qpdf);
  if (QVar3 == 0) {
    p_Var4 = (_qpdf_error *)0x0;
  }
  else {
    local_28 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<QPDFExc,std::allocator<QPDFExc>,QPDFExc&>
              (a_Stack_20,&local_28,(allocator<QPDFExc> *)&local_29,
               (QPDFExc *)
               ((qpdf->warnings).super__List_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl._M_node
                .super__List_node_base._M_next + 1));
    _Var2._M_pi = a_Stack_20[0]._M_pi;
    pQVar1 = local_28;
    local_28 = (QPDFExc *)0x0;
    a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (qpdf->tmp_error).exc.super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
    (qpdf->tmp_error).exc.super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pQVar1;
    (qpdf->tmp_error).exc.super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Var2._M_pi;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
    }
    p_Var4 = &qpdf->tmp_error;
    std::__cxx11::list<QPDFExc,_std::allocator<QPDFExc>_>::pop_front(&qpdf->warnings);
  }
  return p_Var4;
}

Assistant:

qpdf_error
qpdf_next_warning(qpdf_data qpdf)
{
    if (qpdf_more_warnings(qpdf)) {
        qpdf->tmp_error.exc = std::make_shared<QPDFExc>(qpdf->warnings.front());
        qpdf->warnings.pop_front();
        QTC::TC("qpdf", "qpdf-c qpdf_next_warning returned warning");
        return &qpdf->tmp_error;
    } else {
        return nullptr;
    }
}